

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  byte *pbVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  uchar *puVar6;
  int *piVar7;
  int line;
  uint uVar8;
  int iVar9;
  int *piVar10;
  size_t sVar11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  char *pcVar17;
  size_t sVar18;
  uchar *puVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar24;
  undefined4 uVar26;
  ulong uVar25;
  uint local_48;
  
  uVar14 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar14) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbfe,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar4 = ssl->in_msg;
  uVar14 = ((ulong)pbVar4[3] | (ulong)((uint)pbVar4[2] << 8 | (uint)pbVar4[1] << 0x10)) + uVar14;
  ssl->in_hslen = uVar14;
  uVar24 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar4);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xc09,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar24,
             uVar14);
  if ((ssl->conf->field_0x164 & 2) == 0) {
    if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc47,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
    goto LAB_0013b60c;
  }
  pmVar5 = ssl->handshake;
  puVar6 = ssl->in_msg;
  if (pmVar5 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar13 = *(ushort *)(puVar6 + 4) << 8 | *(ushort *)(puVar6 + 4) >> 8;
    if ((uint)uVar13 != pmVar5->in_msg_seq) {
      uVar26 = (undefined4)((ulong)uVar24 >> 0x20);
      if (((uint)uVar13 != pmVar5->in_flight_start_seq - 1) || (*puVar6 == '\x03')) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xc2b,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                   (ulong)uVar13,CONCAT44(uVar26,pmVar5->in_msg_seq),uVar14);
        return -0x6900;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc1e,"received message from last flight, message_seq = %d, start_of_flight = %d",
                 (ulong)uVar13,CONCAT44(uVar26,pmVar5->in_flight_start_seq),uVar14);
      iVar9 = mbedtls_ssl_resend(ssl);
      if (iVar9 == 0) {
        return -0x6900;
      }
      pcVar17 = "mbedtls_ssl_resend";
      line = 0xc22;
      goto LAB_0013b2d1;
    }
  }
  if ((((ssl->in_hslen <= ssl->in_msglen) && (puVar6[8] == '\0' && *(short *)(puVar6 + 6) == 0)) &&
      (puVar6[0xb] == puVar6[3] && *(short *)(puVar6 + 9) == *(short *)(puVar6 + 1))) &&
     ((pmVar5 == (mbedtls_ssl_handshake_params *)0x0 || (pmVar5->hs_msg == (uchar *)0x0))))
  goto LAB_0013b60c;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xc39,"found fragmented DTLS handshake message");
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pcVar17 = "not supported outside handshake (for now)";
    iVar9 = 0xb6d;
LAB_0013b123:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar9,pcVar17);
    iVar9 = -0x7080;
  }
  else {
    sVar18 = ssl->in_hslen;
    uVar1 = sVar18 - 0xc;
    piVar7 = (int *)ssl->handshake->hs_msg;
    if (piVar7 == (int *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb79,"initialize reassembly, total length = %d",uVar1,uVar24,uVar14);
      if (0x4000 < ssl->in_hslen) {
        pcVar17 = "handshake message too large";
        iVar9 = 0xb7d;
        goto LAB_0013b123;
      }
      sVar11 = ((uVar1 >> 3) + sVar18 + 1) - (ulong)((uVar1 & 7) == 0);
      puVar6 = (uchar *)calloc(1,sVar11);
      pmVar5 = ssl->handshake;
      pmVar5->hs_msg = puVar6;
      if (puVar6 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xb87,"alloc failed (%d bytes)",sVar11,uVar24,uVar14);
        iVar9 = -0x7f00;
        goto LAB_0013b2b6;
      }
      puVar19 = ssl->in_msg;
      *(undefined2 *)(puVar6 + 4) = *(undefined2 *)(puVar19 + 4);
      *(undefined4 *)puVar6 = *(undefined4 *)puVar19;
      puVar6 = pmVar5->hs_msg;
      puVar6[8] = '\0';
      puVar6[6] = '\0';
      puVar6[7] = '\0';
      puVar6 = ssl->handshake->hs_msg;
      puVar6[0xb] = puVar6[3];
      *(undefined2 *)(puVar6 + 9) = *(undefined2 *)(puVar6 + 1);
      piVar10 = (int *)ssl->in_msg;
      piVar7 = (int *)ssl->handshake->hs_msg;
LAB_0013b213:
      bVar21 = *(byte *)(piVar10 + 2);
      uVar23 = (ulong)((uint)*(byte *)((long)piVar10 + 7) << 8 |
                      (uint)*(byte *)((long)piVar10 + 6) << 0x10) | (ulong)bVar21;
      uVar22 = (uint)*(byte *)((long)piVar10 + 10) << 8 | (uint)*(byte *)((long)piVar10 + 9) << 0x10
      ;
      bVar15 = *(byte *)((long)piVar10 + 0xb);
      sVar11 = (ulong)bVar15 + (ulong)uVar22;
      if (uVar1 < sVar11 + uVar23) {
        pcVar17 = "invalid fragment offset/len: %d + %d > %d";
        iVar9 = 0xbac;
        uVar25 = sVar11;
        uVar14 = uVar1;
      }
      else {
        uVar2 = sVar11 + 0xc;
        uVar25 = ssl->in_msglen;
        if (uVar2 <= uVar25) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,3000,"adding fragment, offset = %d, length = %d",uVar23,sVar11,uVar14);
          memcpy((void *)((long)piVar7 + uVar23 + 0xc),ssl->in_msg + 0xc,sVar11);
          bVar21 = bVar21 & 7;
          if (bVar21 == 0) {
LAB_0013b40e:
            if ((sVar11 & 7) != 0) {
              uVar14 = uVar23 + sVar11 >> 3;
              bVar21 = *(byte *)((long)piVar7 + uVar14 + sVar18);
              iVar9 = 8 - ((uint)sVar11 & 7);
              do {
                bVar21 = bVar21 | (byte)(1 << ((byte)iVar9 & 0x1f));
                iVar9 = iVar9 + 1;
              } while (iVar9 != 8);
              *(byte *)((long)piVar7 + uVar14 + sVar18) = bVar21;
            }
            memset((void *)((long)piVar7 + (uVar23 >> 3) + sVar18),0xff,sVar11 >> 3);
          }
          else {
            bVar21 = 8 - bVar21;
            uVar14 = uVar23 >> 3;
            uVar20 = (uint)sVar11;
            uVar8 = (uint)bVar21;
            if (uVar20 < bVar21 || uVar20 == uVar8) {
              if (sVar11 != 0) {
                bVar16 = *(byte *)((long)piVar7 + uVar14 + sVar18);
                local_48 = (uint)bVar15;
                iVar9 = uVar8 - (uVar22 + local_48);
                do {
                  bVar16 = bVar16 | (byte)(1 << ((byte)iVar9 & 0x1f));
                  iVar9 = iVar9 + 1;
                  sVar11 = sVar11 - 1;
                } while (sVar11 != 0);
                *(byte *)((long)piVar7 + uVar14 + sVar18) = bVar16;
                sVar11 = 0;
                goto LAB_0013b406;
              }
            }
            else {
              bVar15 = *(byte *)((long)piVar7 + uVar14 + sVar18);
              do {
                uVar8 = uVar8 - 1;
                bVar15 = bVar15 | (byte)(1 << ((byte)uVar8 & 0x1f));
              } while (uVar8 != 0);
              uVar23 = uVar23 + bVar21;
              sVar11 = sVar11 - bVar21;
              *(byte *)((long)piVar7 + uVar14 + sVar18) = bVar15;
LAB_0013b406:
              if (bVar21 < uVar20) goto LAB_0013b40e;
            }
          }
          if (7 < uVar1) {
            uVar14 = 0;
            do {
              if (*(char *)((long)piVar7 + uVar14 + sVar18) != -1) goto LAB_0013b4e8;
              uVar14 = uVar14 + 1;
            } while (uVar1 >> 3 != uVar14);
          }
          if ((uVar1 & 7) != 0) {
            lVar12 = 0;
            do {
              if ((*(byte *)((long)piVar7 + (uVar1 >> 3) + sVar18) >> ((int)lVar12 + 7U & 0x1f) & 1)
                  == 0) goto LAB_0013b4e8;
              lVar12 = lVar12 + -1;
            } while (-lVar12 != (uVar1 & 7));
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xbc7,"handshake message completed");
          if (ssl->in_msglen <= uVar2) {
            uVar14 = ssl->next_record_offset;
            sVar11 = ssl->in_left - uVar14;
            if (uVar14 <= ssl->in_left && sVar11 != 0) {
              puVar6 = ssl->in_hdr;
              sVar18 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar6;
              ssl->next_record_offset = sVar18;
              puVar19 = (uchar *)(sVar18 + sVar11);
              ssl->in_left = (size_t)puVar19;
              if (ssl->in_buf + (0x414d - (long)puVar6) < puVar19) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                           ,0xbe6,"reassembled message too large for buffer");
                iVar9 = -0x6a00;
                goto LAB_0013b2b6;
              }
              memmove(ssl->in_msg + ssl->in_hslen,puVar6 + uVar14,sVar11);
            }
            memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
            free(ssl->handshake->hs_msg);
            ssl->handshake->hs_msg = (uchar *)0x0;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0xbf3,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
LAB_0013b60c:
            if ((ssl->state != 0x10) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
              (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen);
            }
            if ((ssl->conf->field_0x164 & 2) != 0) {
              if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
                puVar3 = &ssl->handshake->in_msg_seq;
                *puVar3 = *puVar3 + 1;
                return 0;
              }
              return 0;
            }
            return 0;
          }
          pcVar17 = "last fragment not alone in its record";
          iVar9 = 0xbd0;
          goto LAB_0013b123;
        }
        pcVar17 = "invalid fragment length: %d + 12 > %d";
        iVar9 = 0xbb3;
        uVar23 = sVar11;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,iVar9,pcVar17,uVar23,uVar25,uVar14);
    }
    else {
      piVar10 = (int *)ssl->in_msg;
      if (*piVar7 == *piVar10) goto LAB_0013b213;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xb97,"fragment header mismatch");
    }
    iVar9 = -0x7200;
  }
LAB_0013b2b6:
  pcVar17 = "ssl_reassemble_dtls_handshake";
  line = 0xc3d;
LAB_0013b2d1:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,line,pcVar17,iVar9);
  return iVar9;
LAB_0013b4e8:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xbc3,"message is not complete yet");
  iVar9 = -0x6900;
  goto LAB_0013b2b6;
}

Assistant:

static int ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER &&
        ssl->handshake != NULL )
    {
        ssl->handshake->update_checksum( ssl, ssl->in_msg, ssl->in_hslen );
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL )
    {
        ssl->handshake->in_msg_seq++;
    }
#endif

    return( 0 );
}